

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O1

double av1_get_min_cr_for_level(AV1_LEVEL level_index,int tier,int is_still_picture)

{
  ulong uVar1;
  long lVar2;
  double dVar3;
  
  if (is_still_picture != 0) {
    return 0.8;
  }
  uVar1 = (ulong)((uint)level_index * 0x50);
  lVar2 = 0x40;
  if (tier != 0) {
    lVar2 = (ulong)(7 < (&av1_level_defs[0].level)[uVar1]) * 8 + 0x40;
  }
  dVar3 = ((double)*(long *)((long)&av1_level_defs[0].max_decode_rate + uVar1) /
          (double)*(long *)((long)&av1_level_defs[0].max_display_rate + uVar1)) *
          *(double *)(&av1_level_defs[0].level + lVar2 + uVar1);
  if (dVar3 <= 0.8) {
    dVar3 = 0.8;
  }
  return dVar3;
}

Assistant:

static double get_min_cr(const AV1LevelSpec *const level_spec, int tier,
                         int is_still_picture, int64_t decoded_sample_rate) {
  if (is_still_picture) return 0.8;
  if (level_spec->level < SEQ_LEVEL_4_0) tier = 0;
  const double min_cr_basis = tier ? level_spec->high_cr : level_spec->main_cr;
  const double speed_adj =
      (double)decoded_sample_rate / level_spec->max_display_rate;
  return AOMMAX(min_cr_basis * speed_adj, 0.8);
}